

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpFormat.h
# Opt level: O1

string * __thiscall
brynet::net::HttpRequest::getResult_abi_cxx11_(string *__return_storage_ptr__,HttpRequest *this)

{
  int iVar1;
  __node_base *p_Var2;
  
  if (getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_);
    if (iVar1 != 0) {
      getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
           (pointer)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_,"HEAD","");
      getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
           (pointer)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 1),"GET",
                 "");
      getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
           (pointer)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 2),"POST"
                 ,"");
      getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[3]._M_dataplus._M_p =
           (pointer)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 3),"PUT",
                 "");
      getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[4]._M_dataplus._M_p =
           (pointer)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 4),
                 "DELETE","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                   ::~array,&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((ulong)this->mMethod < 5) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems[this->mMethod].
                      _M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->mUrl)._M_dataplus._M_p);
  if ((this->mQuery)._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->mQuery)._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var2 = &(this->mHeadField)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var2[1]._M_nxt);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var2[5]._M_nxt);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->mBody)._M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->mBody)._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string      getResult() const
            {
                const static std::array<std::string, static_cast<size_t>(HTTP_METHOD::HTTP_METHOD_MAX)> HttpMethodString =
                        {"HEAD", "GET", "POST", "PUT", "DELETE"};

                std::string ret;
                if (mMethod >= HTTP_METHOD::HTTP_METHOD_HEAD && mMethod < HTTP_METHOD::HTTP_METHOD_MAX)
                {
                    ret += HttpMethodString[static_cast<size_t>(mMethod)];
                }

                ret += " ";
                ret += mUrl;
                if (!mQuery.empty())
                {
                    ret += "?";
                    ret += mQuery;
                }

                ret += " HTTP/1.1\r\n";

                for (auto& v : mHeadField)
                {
                    ret += v.first;
                    ret += ": ";
                    ret += v.second;
                    ret += "\r\n";
                }

                ret += "\r\n";

                if (!mBody.empty())
                {
                    ret += mBody;
                }

                return ret;
            }